

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

void __thiscall draco::PointAttribute::CopyFrom(PointAttribute *this,PointAttribute *src_att)

{
  bool bVar1;
  DataBuffer *pDVar2;
  AttributeTransformData *this_00;
  long in_RSI;
  GeometryAttribute *in_RDI;
  pointer in_stack_ffffffffffffffa8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  *in_stack_ffffffffffffffb0;
  DataBuffer *in_stack_ffffffffffffffb8;
  GeometryAttribute *in_stack_ffffffffffffffc0;
  
  pDVar2 = buffer((PointAttribute *)0x1cc25d);
  if (pDVar2 == (DataBuffer *)0x0) {
    in_stack_ffffffffffffffc0 = (GeometryAttribute *)operator_new(0x28);
    DataBuffer::DataBuffer((DataBuffer *)in_stack_ffffffffffffffc0);
    std::unique_ptr<draco::DataBuffer,std::default_delete<draco::DataBuffer>>::
    unique_ptr<std::default_delete<draco::DataBuffer>,void>
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               in_stack_ffffffffffffffb0,(pointer)in_stack_ffffffffffffffa8);
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::operator=
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               in_stack_ffffffffffffffb0,
               (unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               in_stack_ffffffffffffffa8);
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::~unique_ptr
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               in_stack_ffffffffffffffc0);
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::get
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               in_stack_ffffffffffffffb0);
    GeometryAttribute::ResetBuffer
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (int64_t)in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8);
  }
  bVar1 = GeometryAttribute::CopyFrom(in_RDI,in_stack_ffffffffffffffc0);
  if (bVar1) {
    in_RDI[1].field_0x24 = *(byte *)(in_RSI + 100) & 1;
    *(undefined4 *)&in_RDI[1].normalized_ = *(undefined4 *)(in_RSI + 0x60);
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
    ::operator=(in_stack_ffffffffffffffb0,
                (IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                 *)in_stack_ffffffffffffffa8);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                        *)0x1cc34a);
    if (bVar1) {
      this_00 = (AttributeTransformData *)operator_new(0x30);
      std::
      unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ::operator*((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                   *)this_00);
      AttributeTransformData::AttributeTransformData(this_00,in_stack_ffffffffffffffa8);
      std::
      unique_ptr<draco::AttributeTransformData,std::default_delete<draco::AttributeTransformData>>::
      unique_ptr<std::default_delete<draco::AttributeTransformData>,void>
                ((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                  *)this_00,in_stack_ffffffffffffffa8);
      std::
      unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ::operator=((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                   *)this_00,
                  (unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                   *)in_stack_ffffffffffffffa8);
      std::
      unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ::~unique_ptr((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                     *)in_stack_ffffffffffffffc0);
    }
    else {
      std::
      unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ::operator=((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                   *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

void PointAttribute::CopyFrom(const PointAttribute &src_att) {
  if (buffer() == nullptr) {
    // If the destination attribute doesn't have a valid buffer, create it.
    attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
    ResetBuffer(attribute_buffer_.get(), 0, 0);
  }
  if (!GeometryAttribute::CopyFrom(src_att)) {
    return;
  }
  identity_mapping_ = src_att.identity_mapping_;
  num_unique_entries_ = src_att.num_unique_entries_;
  indices_map_ = src_att.indices_map_;
  if (src_att.attribute_transform_data_) {
    attribute_transform_data_ = std::unique_ptr<AttributeTransformData>(
        new AttributeTransformData(*src_att.attribute_transform_data_));
  } else {
    attribute_transform_data_ = nullptr;
  }
}